

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O0

void __thiscall pg::SSPMSolver::trunc_tmp(SSPMSolver *this,int pindex)

{
  bool bVar1;
  undefined1 local_28 [24];
  int i;
  int pindex_local;
  SSPMSolver *this_local;
  
  if (*this->tmp_d != -1) {
    local_28._16_4_ = this->l;
    local_28._20_4_ = pindex;
    _i = this;
    while( true ) {
      local_28._16_4_ = local_28._16_4_ + -1;
      bVar1 = false;
      if (-1 < (int)local_28._16_4_) {
        bVar1 = (int)local_28._20_4_ < this->tmp_d[(int)local_28._16_4_];
      }
      if (!bVar1) break;
      bitset::operator[]((bitset *)local_28,(size_t)&this->tmp_b);
      bitset::reference::operator=((reference *)local_28,false);
      this->tmp_d[(int)local_28._16_4_] = local_28._20_4_ + 1;
    }
  }
  return;
}

Assistant:

void
SSPMSolver::trunc_tmp(int pindex)
{
    if (tmp_d[0] == -1) return; // already Top
    // compute the lowest pindex >= p
    // [pindex],.,...,.. => [pindex],000
    // if pindex is the bottom, then this simply "buries" the remainder
    for (int i=l-1; i>=0 and tmp_d[i] > pindex; i--) {
        tmp_b[i] = 0;
        tmp_d[i] = pindex+1;
    }
}